

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O0

string * __thiscall
vkt::tessellation::(anonymous_namespace)::Variable::basicSubobjectAtIndex_abi_cxx11_
          (string *__return_storage_ptr__,void *this,int subobjectIndex,int arraySize)

{
  bool bVar1;
  TypeComponentVector *path_;
  allocator<char> local_c9;
  TypeAccessFormat local_c8;
  string local_b8;
  int local_94;
  SubTypeIterator<glu::IsBasicType> local_90;
  undefined1 local_60 [8];
  BasicTypeIterator basicIt;
  undefined1 local_38 [4];
  int currentIndex;
  VarType type;
  int arraySize_local;
  int subobjectIndex_local;
  Variable *this_local;
  
  type.m_data.array.size = arraySize;
  type.m_data._12_4_ = subobjectIndex;
  if ((*(byte *)((long)this + 0x40) & 1) == 0) {
    glu::VarType::VarType((VarType *)local_38,(VarType *)((long)this + 0x28));
  }
  else {
    glu::VarType::VarType((VarType *)local_38,(VarType *)((long)this + 0x28),arraySize);
  }
  basicIt.m_path.super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  glu::SubTypeIterator<glu::IsBasicType>::begin
            ((SubTypeIterator<glu::IsBasicType> *)local_60,(VarType *)local_38);
  do {
    glu::SubTypeIterator<glu::IsBasicType>::end(&local_90,(VarType *)local_38);
    bVar1 = glu::SubTypeIterator<glu::IsBasicType>::operator!=
                      ((SubTypeIterator<glu::IsBasicType> *)local_60,&local_90);
    glu::SubTypeIterator<glu::IsBasicType>::~SubTypeIterator(&local_90);
    if (!bVar1) {
      local_94 = 2;
LAB_00e22206:
      glu::SubTypeIterator<glu::IsBasicType>::~SubTypeIterator
                ((SubTypeIterator<glu::IsBasicType> *)local_60);
      if (local_94 == 2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,(char *)0x0,&local_c9);
        std::allocator<char>::~allocator(&local_c9);
        local_94 = 1;
      }
      glu::VarType::~VarType((VarType *)local_38);
      return __return_storage_ptr__;
    }
    if (basicIt.m_path.
        super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ == type.m_data._12_4_) {
      path_ = glu::SubTypeIterator<glu::IsBasicType>::getPath
                        ((SubTypeIterator<glu::IsBasicType> *)local_60);
      glu::TypeAccessFormat::TypeAccessFormat(&local_c8,(VarType *)local_38,path_);
      de::toString<glu::TypeAccessFormat>(&local_b8,&local_c8);
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)this + 8),&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      local_94 = 1;
      goto LAB_00e22206;
    }
    basicIt.m_path.super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         basicIt.m_path.
         super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    glu::SubTypeIterator<glu::IsBasicType>::operator++
              ((SubTypeIterator<glu::IsBasicType> *)local_60);
  } while( true );
}

Assistant:

std::string Variable::basicSubobjectAtIndex (const int subobjectIndex, const int arraySize) const
{
	const glu::VarType	type		 = m_isArray ? glu::VarType(m_type, arraySize) : m_type;
	int					currentIndex = 0;

	for (glu::BasicTypeIterator basicIt = glu::BasicTypeIterator::begin(&type); basicIt != glu::BasicTypeIterator::end(&type); ++basicIt)
	{
		if (currentIndex == subobjectIndex)
			return m_name + de::toString(glu::TypeAccessFormat(type, basicIt.getPath()));
		++currentIndex;
	}
	DE_ASSERT(false);
	return DE_NULL;
}